

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCore.c
# Opt level: O3

void Acec_MoveDuplicates(Vec_Wec_t *vLits,Vec_Wec_t *vClasses)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  ulong uVar5;
  int Class;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  Vec_Int_t *pVVar9;
  Vec_Int_t *pVVar10;
  Vec_Int_t *pVVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  
  uVar5 = (ulong)(uint)vLits->nSize;
  if (vLits->nSize < 1) {
    uVar15 = 0;
  }
  else {
    uVar16 = 0;
    uVar15 = 0;
    pVVar10 = vLits->pArray;
    do {
      if (uVar16 == (int)uVar5 - 1) break;
      if ((long)vClasses->nSize <= (long)uVar16) {
LAB_00635867:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar1 = vClasses->pArray;
      iVar12 = pVVar10[uVar16].nSize;
      if (iVar12 != pVVar1[uVar16].nSize) {
        __assert_fail("Vec_IntSize(vLevel1) == Vec_IntSize(vLevel2)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/acec/acecCore.c"
                      ,0x148,"void Acec_MoveDuplicates(Vec_Wec_t *, Vec_Wec_t *)");
      }
      pVVar11 = pVVar10;
      if (0 < iVar12) {
        lVar17 = uVar16 + 1;
        uVar8 = 0;
        pVVar9 = pVVar1;
        Class = -1;
        do {
          uVar7 = (uint)uVar8;
          if ((int)uVar7 < 0) {
LAB_006358a5:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          piVar2 = pVVar1[uVar16].pArray;
          iVar6 = piVar2[uVar8];
          if (Class == iVar6) {
            if (iVar12 <= (int)uVar7) goto LAB_006358a5;
            piVar3 = pVVar10[uVar16].pArray;
            iVar6 = piVar3[uVar8];
            pVVar10[uVar16].nSize = iVar12 - 1U;
            if (uVar7 < iVar12 - 1U) {
              uVar5 = uVar8;
              piVar4 = piVar3 + uVar8;
              do {
                *piVar4 = piVar4[1];
                uVar14 = (int)uVar5 + 1;
                uVar5 = (ulong)uVar14;
                piVar4 = piVar4 + 1;
              } while ((int)uVar14 < pVVar10[uVar16].nSize);
            }
            if (pVVar1[uVar16].nSize <= (int)uVar7) {
LAB_00635886:
              __assert_fail("i >= 0 && i < Vec_IntSize(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x408,"void Vec_IntDrop(Vec_Int_t *, int)");
            }
            uVar14 = pVVar1[uVar16].nSize - 1;
            pVVar1[uVar16].nSize = uVar14;
            if (uVar7 < uVar14) {
              piVar4 = piVar2 + uVar8;
              do {
                *piVar4 = piVar4[1];
                uVar14 = (int)uVar8 + 1;
                uVar8 = (ulong)uVar14;
                piVar4 = piVar4 + 1;
              } while ((int)uVar14 < pVVar1[uVar16].nSize);
            }
            if ((uVar7 == 0) || (pVVar10[uVar16].nSize < (int)uVar7)) goto LAB_00635886;
            uVar14 = uVar7 - 1;
            uVar13 = pVVar10[uVar16].nSize - 1;
            pVVar10[uVar16].nSize = uVar13;
            if (uVar14 < uVar13) {
              uVar13 = uVar14;
              piVar3 = piVar3 + uVar14;
              do {
                *piVar3 = piVar3[1];
                uVar13 = uVar13 + 1;
                piVar3 = piVar3 + 1;
              } while ((int)uVar13 < pVVar10[uVar16].nSize);
            }
            if (pVVar1[uVar16].nSize < (int)uVar7) goto LAB_00635886;
            uVar13 = pVVar1[uVar16].nSize - 1;
            pVVar1[uVar16].nSize = uVar13;
            if (uVar14 < uVar13) {
              piVar2 = piVar2 + uVar14;
              do {
                *piVar2 = piVar2[1];
                uVar14 = uVar14 + 1;
                piVar2 = piVar2 + 1;
              } while ((int)uVar14 < pVVar1[uVar16].nSize);
            }
            if ((vLits->nSize <= lVar17) || (vClasses->nSize <= lVar17)) goto LAB_00635867;
            Vec_IntInsertOrder(pVVar11 + lVar17,pVVar9 + lVar17,iVar6,Class);
            iVar12 = pVVar10[uVar16].nSize;
            if (iVar12 != pVVar1[uVar16].nSize) {
              __assert_fail("Vec_IntSize(vLevel1) == Vec_IntSize(vLevel2)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/acec/acecCore.c"
                            ,0x15c,"void Acec_MoveDuplicates(Vec_Wec_t *, Vec_Wec_t *)");
            }
            uVar5 = (ulong)vLits->nSize;
            if (((long)uVar5 <= lVar17) || (vClasses->nSize <= lVar17)) goto LAB_00635867;
            pVVar11 = vLits->pArray;
            pVVar9 = vClasses->pArray;
            if (pVVar11[lVar17].nSize != pVVar9[lVar17].nSize) {
              __assert_fail("Vec_IntSize(Vec_WecEntry(vLits, i+1)) == Vec_IntSize(Vec_WecEntry(vClasses, i+1))"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/acec/acecCore.c"
                            ,0x15d,"void Acec_MoveDuplicates(Vec_Wec_t *, Vec_Wec_t *)");
            }
            uVar7 = uVar7 - 2;
            uVar15 = uVar15 + 1;
            iVar6 = -1;
          }
          uVar8 = (ulong)(uVar7 + 1);
          Class = iVar6;
        } while ((int)(uVar7 + 1) < iVar12);
      }
      uVar16 = uVar16 + 1;
      pVVar10 = pVVar11;
    } while ((long)uVar16 < (long)(int)uVar5);
  }
  printf("Moved %d pairs of PPs to normalize the matrix.\n",(ulong)uVar15);
  return;
}

Assistant:

void Acec_MoveDuplicates( Vec_Wec_t * vLits, Vec_Wec_t * vClasses )
{
    Vec_Int_t * vLevel1, * vLevel2; 
    int i, k, Prev, This, Entry, Counter = 0;
    Vec_WecForEachLevel( vLits, vLevel1, i )
    {
        if ( i == Vec_WecSize(vLits) - 1 )
            break;
        vLevel2 = Vec_WecEntry(vClasses, i);
        assert( Vec_IntSize(vLevel1) == Vec_IntSize(vLevel2) );
        Prev = -1;
        Vec_IntForEachEntry( vLevel2, This, k )
        {
            if ( Prev != This )
            {
                Prev = This;
                continue;
            }
            Prev = -1;
            Entry = Vec_IntEntry( vLevel1, k );

            Vec_IntDrop( vLevel1, k );
            Vec_IntDrop( vLevel2, k-- );

            Vec_IntDrop( vLevel1, k );
            Vec_IntDrop( vLevel2, k-- );

            Vec_IntInsertOrder( Vec_WecEntry(vLits, i+1), Vec_WecEntry(vClasses, i+1), Entry, This );

            assert( Vec_IntSize(vLevel1)                  == Vec_IntSize(vLevel2) );
            assert( Vec_IntSize(Vec_WecEntry(vLits, i+1)) == Vec_IntSize(Vec_WecEntry(vClasses, i+1)) );
            Counter++;
        }
    }
    printf( "Moved %d pairs of PPs to normalize the matrix.\n", Counter );
}